

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_tRNS(png_structrp png_ptr,png_const_bytep trans_alpha,png_const_color_16p tran,
                   int num_trans,int color_type)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 in_RAX;
  size_t length;
  char *error_message;
  png_byte buf [6];
  undefined8 uStack_8;
  
  uStack_8._0_2_ = (undefined2)in_RAX;
  uStack_8 = in_RAX;
  if (color_type == 0) {
    uVar1 = tran->gray;
    if ((int)(uint)uVar1 < 1 << (png_ptr->bit_depth & 0x1f)) {
      uStack_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
      uStack_8._0_4_ = CONCAT22(uVar1 << 8 | uVar1 >> 8,(undefined2)uStack_8);
      length = 2;
LAB_001342ab:
      png_write_complete_chunk(png_ptr,0x74524e53,(png_const_bytep)((long)&uStack_8 + 2),length);
      return;
    }
    error_message = "Ignoring attempt to write tRNS chunk out-of-range for bit_depth";
  }
  else if (color_type == 2) {
    uVar1 = tran->red;
    uStack_8._0_4_ = CONCAT22(uVar1 << 8 | uVar1 >> 8,(undefined2)uStack_8);
    uVar2 = tran->green;
    uVar3 = tran->blue;
    uStack_8 = CONCAT26(uVar3 << 8 | uVar3 >> 8,
                        CONCAT24(uVar2 << 8 | uVar2 >> 8,(undefined4)uStack_8));
    if ((png_ptr->bit_depth != '\b') ||
       (((char)(uVar2 >> 8) == '\0' && (char)(uVar1 >> 8) == '\0') && (char)(uVar3 >> 8) == '\0')) {
      length = 6;
      goto LAB_001342ab;
    }
    error_message = "Ignoring attempt to write 16-bit tRNS chunk when bit_depth is 8";
  }
  else if (color_type == 3) {
    if ((0 < num_trans) && ((uint)num_trans <= (uint)png_ptr->num_palette)) {
      png_write_complete_chunk(png_ptr,0x74524e53,trans_alpha,(ulong)(uint)num_trans);
      return;
    }
    error_message = "Invalid number of transparent colors specified";
  }
  else {
    error_message = "Can\'t write tRNS with an alpha channel";
  }
  png_app_warning(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_write_tRNS(png_structrp png_ptr, png_const_bytep trans_alpha,
    png_const_color_16p tran, int num_trans, int color_type)
{
   png_byte buf[6];

   png_debug(1, "in png_write_tRNS");

   if (color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if (num_trans <= 0 || num_trans > (int)png_ptr->num_palette)
      {
         png_app_warning(png_ptr,
             "Invalid number of transparent colors specified");
         return;
      }

      /* Write the chunk out as it is */
      png_write_complete_chunk(png_ptr, png_tRNS, trans_alpha,
          (size_t)num_trans);
   }

   else if (color_type == PNG_COLOR_TYPE_GRAY)
   {
      /* One 16-bit value */
      if (tran->gray >= (1 << png_ptr->bit_depth))
      {
         png_app_warning(png_ptr,
             "Ignoring attempt to write tRNS chunk out-of-range for bit_depth");

         return;
      }

      png_save_uint_16(buf, tran->gray);
      png_write_complete_chunk(png_ptr, png_tRNS, buf, 2);
   }

   else if (color_type == PNG_COLOR_TYPE_RGB)
   {
      /* Three 16-bit values */
      png_save_uint_16(buf, tran->red);
      png_save_uint_16(buf + 2, tran->green);
      png_save_uint_16(buf + 4, tran->blue);
#ifdef PNG_WRITE_16BIT_SUPPORTED
      if (png_ptr->bit_depth == 8 && (buf[0] | buf[2] | buf[4]) != 0)
#else
      if ((buf[0] | buf[2] | buf[4]) != 0)
#endif
      {
         png_app_warning(png_ptr,
             "Ignoring attempt to write 16-bit tRNS chunk when bit_depth is 8");
         return;
      }

      png_write_complete_chunk(png_ptr, png_tRNS, buf, 6);
   }

   else
   {
      png_app_warning(png_ptr, "Can't write tRNS with an alpha channel");
   }
}